

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGNode.h
# Opt level: O0

void __thiscall dg::sdg::DGNodeArtificial::~DGNodeArtificial(DGNodeArtificial *this)

{
  void *in_RDI;
  
  ~DGNodeArtificial((DGNodeArtificial *)0x10acb8);
  operator_delete(in_RDI,0x140);
  return;
}

Assistant:

DGNodeArtificial(DependenceGraph &g)
            : DGNode(g, DGElementType::ND_ARTIFICIAL) {}